

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_typeof(lua_State *L)

{
  uint64_t uVar1;
  CTypeID size;
  lua_State *L_00;
  void *pvVar2;
  TValue *in_RDI;
  CTState *unaff_retaddr;
  GCcdata *cd;
  CTypeID id;
  CTState *cts;
  GCcdata *cd_1;
  CTState *cts_1;
  undefined4 in_stack_ffffffffffffff78;
  
  L_00 = (lua_State *)(ulong)*(uint *)((ulong)in_RDI[1].u32.lo + 0xfc);
  L_00->base = in_RDI;
  size = ffi_checkctype((lua_State *)cd,unaff_retaddr,in_RDI);
  pvVar2 = lj_mem_newgco(L_00,size);
  *(undefined1 *)((long)pvVar2 + 5) = 10;
  *(undefined2 *)((long)pvVar2 + 6) = 0x15;
  *(CTypeID *)((long)pvVar2 + 8) = size;
  uVar1 = in_RDI[3].u64;
  *(int *)(uVar1 - 8) = (int)pvVar2;
  *(undefined4 *)(uVar1 - 4) = 0xfffffff5;
  if (*(uint *)((ulong)in_RDI[1].u32.lo + 0x24) <= *(uint *)((ulong)in_RDI[1].u32.lo + 0x20)) {
    lj_gc_step((lua_State *)CONCAT44(size,in_stack_ffffffffffffff78));
  }
  return 1;
}

Assistant:

LJLIB_CF(ffi_typeof)	LJLIB_REC(.)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = ffi_checkctype(L, cts, L->base+1);
  GCcdata *cd = lj_cdata_new(cts, CTID_CTYPEID, 4);
  *(CTypeID *)cdataptr(cd) = id;
  setcdataV(L, L->top-1, cd);
  lj_gc_check(L);
  return 1;
}